

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O2

MPP_RET write_unpaired_field(H264dVideoCtx_t *p_Vid,H264_FrameStore_t *fs)

{
  int iVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  RK_S32 RVar4;
  MPP_RET MVar5;
  uint uVar6;
  H264_StorePic_t *pHVar7;
  char *fmt;
  h264_store_pic_t *phVar8;
  undefined8 uVar9;
  
  uVar6 = fs->is_used;
  if (2 < (int)uVar6) {
    MVar5 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_VALUE;
    }
    fmt = "value error(%d).\n";
    uVar9 = 0x3b6;
    goto LAB_00190d26;
  }
  if ((uVar6 & 1) != 0) {
    phVar8 = fs->top_field;
    pHVar7 = alloc_storable_picture(p_Vid,2);
    fs->bottom_field = pHVar7;
    if (pHVar7 == (H264_StorePic_t *)0x0) {
      MVar5 = MPP_ERR_MALLOC;
      if (((byte)h264d_debug & 1) == 0) {
        return MPP_ERR_MALLOC;
      }
      fmt = "malloc buffer error(%d).\n";
      uVar9 = 0x3ba;
      goto LAB_00190d26;
    }
    pHVar7->mem_malloc_type = Mem_UnPaired;
    pHVar7->chroma_format_idc = phVar8->chroma_format_idc;
    MVar5 = dpb_combine_field_yuv(p_Vid,fs,'\0');
    if (MVar5 < MPP_OK) {
      if (((byte)h264d_debug & 4) == 0) {
        return MVar5;
      }
      fmt = "Function error(%d).\n";
      uVar9 = 0x3bd;
      goto LAB_00190d26;
    }
    phVar8 = fs->frame;
    phVar8->view_id = fs->view_id;
    phVar8->mem_malloc_type = Mem_TopOnly;
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","write frame, line %d",(char *)0x0,0x3c0);
      phVar8 = fs->frame;
    }
    write_picture(phVar8,p_Vid);
    uVar6 = fs->is_used;
  }
  if ((uVar6 & 2) != 0) {
    phVar8 = fs->bottom_field;
    pHVar7 = alloc_storable_picture(p_Vid,1);
    fs->top_field = pHVar7;
    if (pHVar7 == (H264_StorePic_t *)0x0) {
      MVar5 = MPP_ERR_MALLOC;
      if (((byte)h264d_debug & 1) == 0) {
        return MPP_ERR_MALLOC;
      }
      fmt = "malloc buffer error(%d).\n";
      uVar9 = 0x3c7;
    }
    else {
      pHVar7->mem_malloc_type = Mem_UnPaired;
      pHVar7->chroma_format_idc = phVar8->chroma_format_idc;
      phVar8 = fs->bottom_field;
      iVar1 = phVar8->frame_cropping_flag;
      pHVar7->frame_cropping_flag = iVar1;
      if (iVar1 != 0) {
        RVar2 = phVar8->frame_crop_right_offset;
        RVar3 = phVar8->frame_crop_top_offset;
        RVar4 = phVar8->frame_crop_bottom_offset;
        pHVar7->frame_crop_left_offset = phVar8->frame_crop_left_offset;
        pHVar7->frame_crop_right_offset = RVar2;
        pHVar7->frame_crop_top_offset = RVar3;
        pHVar7->frame_crop_bottom_offset = RVar4;
      }
      MVar5 = dpb_combine_field_yuv(p_Vid,fs,'\0');
      if (MPP_NOK < MVar5) {
        phVar8 = fs->frame;
        phVar8->view_id = fs->view_id;
        phVar8->mem_malloc_type = Mem_BotOnly;
        if (((byte)h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_dpb","write frame, line %d",(char *)0x0,0x3d4);
          phVar8 = fs->frame;
        }
        write_picture(phVar8,p_Vid);
        goto LAB_00190cf4;
      }
      if (((byte)h264d_debug & 4) == 0) {
        return MVar5;
      }
      fmt = "Function error(%d).\n";
      uVar9 = 0x3d1;
    }
LAB_00190d26:
    _mpp_log_l(4,"h264d_dpb",fmt,(char *)0x0,uVar9);
    return MVar5;
  }
LAB_00190cf4:
  fs->is_used = 3;
  return MPP_OK;
}

Assistant:

static MPP_RET write_unpaired_field(H264dVideoCtx_t *p_Vid, H264_FrameStore_t *fs)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_StorePic_t *p = NULL;

    VAL_CHECK(ret, fs->is_used < 3);
    if (fs->is_used & 0x01) { // we have a top field, construct an empty bottom field
        p = fs->top_field;
        fs->bottom_field = alloc_storable_picture(p_Vid, BOTTOM_FIELD);
        MEM_CHECK(ret, fs->bottom_field);
        fs->bottom_field->mem_malloc_type = Mem_UnPaired;
        fs->bottom_field->chroma_format_idc = p->chroma_format_idc;
        FUN_CHECK(ret = dpb_combine_field_yuv(p_Vid, fs, 0));
        fs->frame->view_id = fs->view_id;
        fs->frame->mem_malloc_type = Mem_TopOnly;
        H264D_WARNNING("write frame, line %d", __LINE__);
        write_picture(fs->frame, p_Vid);
    }

    if (fs->is_used & 0x02) { // we have a bottom field, construct an empty top field
        p = fs->bottom_field;
        fs->top_field = alloc_storable_picture(p_Vid, TOP_FIELD);
        MEM_CHECK(ret, fs->top_field);
        fs->top_field->mem_malloc_type = Mem_UnPaired;
        fs->top_field->chroma_format_idc = p->chroma_format_idc;
        fs->top_field->frame_cropping_flag = fs->bottom_field->frame_cropping_flag;
        if (fs->top_field->frame_cropping_flag) {
            fs->top_field->frame_crop_top_offset = fs->bottom_field->frame_crop_top_offset;
            fs->top_field->frame_crop_bottom_offset = fs->bottom_field->frame_crop_bottom_offset;
            fs->top_field->frame_crop_left_offset = fs->bottom_field->frame_crop_left_offset;
            fs->top_field->frame_crop_right_offset = fs->bottom_field->frame_crop_right_offset;
        }
        FUN_CHECK(ret = dpb_combine_field_yuv(p_Vid, fs, 0));
        fs->frame->view_id = fs->view_id;
        fs->frame->mem_malloc_type = Mem_BotOnly;
        H264D_WARNNING("write frame, line %d", __LINE__);
        write_picture(fs->frame, p_Vid);
    }
    fs->is_used = 3;

    return ret = MPP_OK;
__FAILED:
    return ret;
}